

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

double __thiscall Alice::ObliviousMultiplication(Alice *this,long arg1,long arg2)

{
  pointer plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  Message MVar8;
  undefined1 auStack_38 [8];
  Message msg_for_Bob;
  
  iVar6 = (this->super_Party).rc;
  plVar1 = (this->super_Party).Randoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_Party).Randoms.super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar1 >> 3) <
      (long)iVar6 + 3U) {
    iVar6 = 0;
  }
  msg_for_Bob.scalar2 = (long)(double)(arg2 * arg1);
  (this->super_Party).rc = iVar6;
  auStack_38 = (undefined1  [8])(arg1 - plVar1[iVar6]);
  msg_for_Bob.scalar1 = arg2 - plVar1[(long)iVar6 + 2];
  Server::Send(this->srv,(Message *)auStack_38);
  MVar8 = Server::Receive(this->srv);
  lVar7 = (long)(this->super_Party).rc;
  plVar1 = (this->super_Party).Randoms.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = plVar1[lVar7];
  lVar3 = plVar1[lVar7 + 1];
  lVar4 = plVar1[lVar7 + 2];
  lVar5 = plVar1[lVar7 + 3];
  (this->super_Party).rc =
       (int)((lVar7 + 4U) %
            (ulong)((long)(this->super_Party).Randoms.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)plVar1 >> 3));
  return (double)((arg2 + lVar4) * MVar8.scalar2 + lVar5) * 0.5 +
         (double)((arg1 + lVar2) * MVar8.scalar1 + lVar3) * 0.5 + (double)msg_for_Bob.scalar2;
}

Assistant:

double Alice::ObliviousMultiplication(long arg1, long arg2)
{
    double result = arg1 * arg2; //Alice locally computes x'y'
    Message msg_for_Bob, msg_from_Bob;
    rc = ((rc + 3) <= Randoms.size() ? rc : 0);
    msg_for_Bob.scalar1 = arg1 - Randoms[rc];     //for computing x'y"
    msg_for_Bob.scalar2 = arg2 - Randoms[rc + 2]; //for computing x"y'
    srv->Send(msg_for_Bob);
    msg_from_Bob = srv->Receive();
    result += ((arg1 + Randoms[rc]) * (msg_from_Bob.scalar1) + Randoms[rc + 1]) /(double)2;
    result += ((arg2 + Randoms[rc + 2]) * (msg_from_Bob.scalar2) + Randoms[rc + 3]) /(double)2;
    rc = (rc+4) % Randoms.size();
    // printf("Alice's Share: %f\n", result);
    return result;
}